

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void dequantize_row_q4_1(block_q4_1 *x,float *y,int64_t k)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [16];
  uint uVar11;
  uint8_t *puVar12;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  byte bVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  
  auVar10 = _DAT_0014e6e0;
  lVar15 = k + 0x1f;
  if (-1 < k) {
    lVar15 = k;
  }
  uVar11 = (uint)(lVar15 >> 5);
  if (0 < (int)uVar11) {
    puVar12 = x->qs;
    pfVar14 = y + 0x10;
    uVar13 = 0;
    do {
      fVar2 = ggml_table_f32_f16[x[uVar13].field_0.field_0.d];
      fVar3 = ggml_table_f32_f16[x[uVar13].field_0.field_0.m];
      lVar15 = 0;
      do {
        uVar4 = *(undefined4 *)(puVar12 + lVar15);
        bVar17 = (byte)((uint)uVar4 >> 0x18);
        uVar8 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
        auVar5._8_4_ = 0;
        auVar5._0_8_ = uVar8;
        auVar5[0xc] = bVar17;
        auVar6[8] = (char)((uint)uVar4 >> 0x10);
        auVar6._0_8_ = uVar8;
        auVar6[9] = 0;
        auVar6._10_3_ = auVar5._10_3_;
        auVar9._5_8_ = 0;
        auVar9._0_5_ = auVar6._8_5_;
        auVar16._0_4_ = (uint)uVar8;
        auVar7[4] = (char)((uint)uVar4 >> 8);
        auVar7._0_4_ = auVar16._0_4_;
        auVar7[5] = 0;
        auVar7._6_7_ = SUB137(auVar9 << 0x40,6);
        auVar16._4_9_ = auVar7._4_9_;
        auVar16._13_3_ = 0;
        auVar18 = auVar16 & auVar10;
        pfVar1 = pfVar14 + lVar15 + -0x10;
        *pfVar1 = (float)auVar18._0_4_ * fVar2 + fVar3;
        pfVar1[1] = (float)auVar18._4_4_ * fVar2 + fVar3;
        pfVar1[2] = (float)auVar18._8_4_ * fVar2 + fVar3;
        pfVar1[3] = (float)auVar18._12_4_ * fVar2 + fVar3;
        pfVar1 = pfVar14 + lVar15;
        *pfVar1 = (float)(auVar16._0_4_ >> 4) * fVar2 + fVar3;
        pfVar1[1] = (float)(auVar7._4_4_ >> 4) * fVar2 + fVar3;
        pfVar1[2] = (float)(auVar6._8_4_ >> 4) * fVar2 + fVar3;
        pfVar1[3] = (float)(bVar17 >> 4) * fVar2 + fVar3;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x10);
      uVar13 = uVar13 + 1;
      puVar12 = puVar12 + 0x14;
      pfVar14 = pfVar14 + 0x20;
    } while (uVar13 != (uVar11 & 0x7fffffff));
  }
  return;
}

Assistant:

void dequantize_row_q4_1(const block_q4_1 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    static const int qk = QK4_1;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);
        const float m = GGML_FP16_TO_FP32(x[i].m);

        for (int j = 0; j < qk/2; ++j) {
            const int x0 = (x[i].qs[j] & 0x0F);
            const int x1 = (x[i].qs[j] >>   4);

            y[i*qk + j + 0   ] = x0*d + m;
            y[i*qk + j + qk/2] = x1*d + m;
        }
    }
}